

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void duckdb::QuantileOperation::
     ConstantOperation<duckdb::date_t,duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::timestamp_t,false>>
               (QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *state,date_t *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  iterator __position;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  if (count != 0) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT44(input->days,(undefined4)uStack_28);
      __position._M_current =
           (state->v).super_vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>.
           super__Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (state->v).super_vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>.
          super__Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>::
        _M_realloc_insert<duckdb::date_t>
                  ((vector<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)state,__position,
                   (date_t *)((long)&uStack_28 + 4));
      }
      else {
        (__position._M_current)->days = input->days;
        (state->v).super_vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>.
        super__Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}